

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWritePI(xmlTextWriterPtr writer,xmlChar *target,xmlChar *content)

{
  int iVar1;
  int local_30;
  int sum;
  int count;
  xmlChar *content_local;
  xmlChar *target_local;
  xmlTextWriterPtr writer_local;
  
  local_30 = xmlTextWriterStartPI(writer,target);
  if (local_30 == -1) {
    writer_local._4_4_ = -1;
  }
  else {
    if (content != (xmlChar *)0x0) {
      iVar1 = xmlTextWriterWriteString(writer,content);
      if (iVar1 == -1) {
        return -1;
      }
      local_30 = iVar1 + local_30;
    }
    iVar1 = xmlTextWriterEndPI(writer);
    if (iVar1 == -1) {
      writer_local._4_4_ = -1;
    }
    else {
      writer_local._4_4_ = iVar1 + local_30;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWritePI(xmlTextWriterPtr writer, const xmlChar * target,
                     const xmlChar * content)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartPI(writer, target);
    if (count == -1)
        return -1;
    sum += count;
    if (content != 0) {
        count = xmlTextWriterWriteString(writer, content);
        if (count == -1)
            return -1;
        sum += count;
    }
    count = xmlTextWriterEndPI(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}